

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O1

bool VerifyCharacterVector
               (Verifier *verifier,Vector<flatbuffers::Offset<void>,_unsigned_int> *values,
               Vector<unsigned_char,_unsigned_int> *types)

{
  bool bVar1;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *str;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  if (values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 ||
      types == (Vector<unsigned_char,_unsigned_int> *)0x0) {
    bVar5 = values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 &&
            types == (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else if (*(int *)values == *(int *)types) {
    bVar5 = *(int *)values == 0;
    if (!bVar5) {
      uVar4 = 0;
      uVar3 = 0;
      do {
        if (*(uint *)types <= uVar3) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                       );
        }
        if ((byte)types[uVar3 + 4] - 1 < 6) {
          str = values + (ulong)*(uint *)(values + (ulong)uVar4 + 4) + (ulong)uVar4 + 4;
          switch((uint)(byte)types[uVar3 + 4]) {
          case 1:
            bVar1 = Attacker::Verify((Attacker *)str,verifier);
            break;
          default:
            uVar2 = (long)str - (long)verifier->buf_;
            if (((uVar2 & 3) != 0) && (((verifier->opts_).check_alignment & 1U) != 0)) {
              return bVar5;
            }
            bVar1 = uVar2 <= verifier->size_ - 4 && 4 < verifier->size_;
            break;
          case 5:
          case 6:
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,(String *)str);
          }
          if (bVar1 == false) {
            return bVar5;
          }
        }
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 + 4;
        bVar5 = uVar3 >= *(uint *)values;
      } while (uVar3 < *(uint *)values);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool VerifyCharacterVector(::flatbuffers::Verifier &verifier, const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, const ::flatbuffers::Vector<uint8_t> *types) {
  if (!values || !types) return !values && !types;
  if (values->size() != types->size()) return false;
  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {
    if (!VerifyCharacter(
        verifier,  values->Get(i), types->GetEnum<Character>(i))) {
      return false;
    }
  }
  return true;
}